

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

bool __thiscall Symbol_table::is_declared(Symbol_table *this,string *s)

{
  bool bVar1;
  __type _Var2;
  reference __lhs;
  Variable *var;
  iterator __end1;
  iterator __begin1;
  Vector<Variable> *__range1;
  string *s_local;
  Symbol_table *this_local;
  
  __end1 = std::vector<Variable,_std::allocator<Variable>_>::begin
                     ((vector<Variable,_std::allocator<Variable>_> *)this);
  var = (Variable *)
        std::vector<Variable,_std::allocator<Variable>_>::end
                  ((vector<Variable,_std::allocator<Variable>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>
                                *)&var);
    if (!bVar1) {
      return false;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>::
            operator*(&__end1);
    _Var2 = std::operator==(&__lhs->name,s);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool Symbol_table::is_declared(const string& s)
{
	for (auto&& var : var_table)
		if (var.name == s)
			return true;
	return false;
}